

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O0

float * linb::any_cast<float>(any *operand)

{
  bool bVar1;
  any *operand_local;
  
  if ((operand == (any *)0x0) ||
     (bVar1 = any::is_typed(operand,(type_info *)&float::typeinfo), !bVar1)) {
    operand_local = (any *)0x0;
  }
  else {
    operand_local = (any *)any::cast<float>(operand);
  }
  return (float *)operand_local;
}

Assistant:

inline ValueType* any_cast(any* operand) noexcept
{
    using T = typename std::decay<ValueType>::type;

#ifndef ANY_IMPL_NO_RTTI
    if (operand && operand->is_typed(typeid(T)))
#else
    if (operand && operand->vtable == any::vtable_for_type<T>())
#endif
        return operand->cast<ValueType>();
    else
        return nullptr;
}

inline void swap(any& lhs, any& rhs) noexcept
{
    lhs.swap(rhs);
}

template <typename T, typename... Args>
any make_any(Args&&... args)
{
    return any(in_place_type_t<T>{}, std::forward<Args>(args)...);
}

template <typename T, typename U, typename... Args>
any make_any(std::initializer_list<U> il, Args&&... args)
{
    return any(in_place_type_t<T>{}, il, std::forward<Args>(args)...);
}
}